

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

real __thiscall fasttext::DenseMatrix::l2NormRow(DenseMatrix *this,int64_t i)

{
  float fVar1;
  long lVar2;
  pointer pfVar3;
  runtime_error *this_00;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  
  lVar2 = (this->super_Matrix).n_;
  auVar9 = ZEXT816(0) << 0x40;
  auVar10 = ZEXT1664(auVar9);
  if (0 < lVar2) {
    pfVar3 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = i * lVar2;
    uVar4 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
    uVar7 = 0;
    if (uVar6 <= uVar4) {
      uVar7 = uVar4 - uVar6;
    }
    if (uVar7 <= lVar2 - 1U) {
      __assert_fail("i * n_ + j < data_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.h"
                    ,0x2d,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
    }
    lVar5 = 0;
    do {
      fVar1 = pfVar3[uVar6 + lVar5];
      lVar5 = lVar5 + 1;
      dVar8 = auVar10._0_8_ + (double)(fVar1 * fVar1);
      auVar10 = ZEXT864((ulong)dVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar8;
    } while (lVar2 != lVar5);
    if (NAN(dVar8)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Encountered NaN.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (auVar9._0_8_ < 0.0) {
    dVar8 = sqrt(auVar9._0_8_);
  }
  else {
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    dVar8 = auVar9._0_8_;
  }
  return (float)dVar8;
}

Assistant:

real DenseMatrix::l2NormRow(int64_t i) const {
  auto norm = 0.0;
  for (auto j = 0; j < n_; j++) {
    norm += at(i, j) * at(i, j);
  }
  if (std::isnan(norm)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return std::sqrt(norm);
}